

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo_x86.c
# Opt level: O0

void ParseExtraAMDCpuId(X86Info *info,OsSupport os_support)

{
  _Bool _Var1;
  ulong in_RSI;
  ulong *in_RDI;
  Leaf LVar2;
  X86Features *features;
  Leaf leaf_80000001;
  uint32_t max_extended_cpuid_leaf;
  Leaf leaf_80000000;
  undefined4 local_2c;
  
  CpuId(0);
  LVar2 = SafeCpuId(0,0x1042f4);
  local_2c = LVar2.ecx;
  if ((in_RSI & 0x100) != 0) {
    _Var1 = IsBitSet(local_2c,6);
    *in_RDI = *in_RDI & 0xfffffffffdffffff | (ulong)_Var1 << 0x19;
  }
  if ((in_RSI & 0x10000) != 0) {
    _Var1 = IsBitSet(local_2c,0x10);
    *in_RDI = *in_RDI & 0xfffffffffffffeff | (ulong)_Var1 << 8;
  }
  return;
}

Assistant:

static void ParseExtraAMDCpuId(X86Info* info, OsSupport os_support) {
  const Leaf leaf_80000000 = CpuId(0x80000000);
  const uint32_t max_extended_cpuid_leaf = leaf_80000000.eax;
  const Leaf leaf_80000001 = SafeCpuId(max_extended_cpuid_leaf, 0x80000001);

  X86Features* const features = &info->features;

  if (os_support.have_sse_via_cpuid) {
    features->sse4a = IsBitSet(leaf_80000001.ecx, 6);
  }

  if (os_support.have_avx) {
    features->fma4 = IsBitSet(leaf_80000001.ecx, 16);
  }
}